

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_4.hpp
# Opt level: O2

schema_validator_ptr_type __thiscall
jsoncons::jsonschema::draft4::
schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_schema_validator
          (schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
          keys,anchor_uri_map_type *anchor_dict)

{
  schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  sVar1;
  undefined8 uVar2;
  byte bVar3;
  undefined1 uVar4;
  json_type jVar5;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  const_iterator cVar6;
  schema_error *this_01;
  _Alloc_hider _Var7;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *item;
  byte bVar8;
  long lVar9;
  uri_wrapper *uri_1;
  bool bVar10;
  string_view str;
  const_object_iterator cVar11;
  undefined8 in_stack_00000008;
  undefined1 local_470 [24];
  uri_wrapper *uri;
  undefined1 local_450 [40];
  vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
  validators;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> default_value;
  string sub_keys [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
  defs;
  uri relative;
  uri id;
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  new_context;
  
  local_470._8_8_ = context;
  uri = (uri_wrapper *)sch;
  (**(code **)((context->base_uri_).uri_.uri_string_._M_dataplus._M_p + 0x10))(&new_context);
  (this->
  super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  )._vptr_schema_validator_factory_base = (_func_int **)0x0;
  local_470._16_8_ = (uri_wrapper *)keys.data_;
  local_450._8_8_ = this;
  jVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     keys.data_);
  uVar2 = local_470._16_8_;
  if (jVar5 == bool_value) {
    schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::make_boolean_schema
              ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)sub_keys,
               (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_470._8_8_,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &new_context);
    _Var7 = sub_keys[0]._M_dataplus;
    *(pointer *)local_450._8_8_ = sub_keys[0]._M_dataplus._M_p;
    for (; new_context.uris_.
           super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           new_context.uris_.
           super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        new_context.uris_.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_start =
             new_context.uris_.
             super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::insert_schema((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)local_470._8_8_,
                      new_context.uris_.
                      super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)_Var7._M_p);
    }
    goto LAB_003c22c3;
  }
  if (jVar5 != object_value) {
    this_01 = (schema_error *)__cxa_allocate_exception(0x18);
    jsoncons::uri::uri((uri *)sub_keys,(uri *)&new_context);
    std::operator+(&id.uri_string_,"invalid JSON-type for a schema for ",sub_keys);
    std::operator+(&relative.uri_string_,&id.uri_string_,", expected: boolean or object");
    schema_error::schema_error(this_01,&relative.uri_string_);
    __cxa_throw(this_01,&schema_error::typeinfo,schema_error::~schema_error);
  }
  sub_keys[0]._M_dataplus._M_p = (pointer)0x4;
  sub_keys[0]._M_string_length = (size_type)anon_var_dwarf_1ea416c;
  cVar11 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::find_abi_cxx11_
                     ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                      local_470._16_8_,(string_view_type *)sub_keys);
  local_450._32_8_ = cVar11.it_._M_current;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
            ((const_object_range_type *)sub_keys,
             (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)uVar2);
  uVar2 = local_470._16_8_;
  if ((((undefined1  [16])cVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     ((sub_keys[0].field_2._M_local_buf[8] & 1) == 0)) {
    bVar10 = cVar11.has_value_ == (bool)sub_keys[0].field_2._8_1_;
  }
  else {
    bVar10 = local_450._32_8_ == sub_keys[0].field_2._M_allocated_capacity;
  }
  if (bVar10) {
    make_object_schema_validator
              ((schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)sub_keys,
               (compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_470._8_8_,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               &new_context,(anchor_uri_map_type *)local_470._16_8_);
    local_450._16_8_ = sub_keys[0]._M_dataplus._M_p;
    *(pointer *)local_450._8_8_ = sub_keys[0]._M_dataplus._M_p;
  }
  else {
    validators.
    super__Vector_base<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    validators.
    super__Vector_base<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    validators.
    super__Vector_base<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    defs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &defs._M_t._M_impl.super__Rb_tree_header._M_header;
    defs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    defs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    defs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sub_keys[0]._M_dataplus._M_p = &DAT_0000000b;
    sub_keys[0]._M_string_length = (size_type)anon_var_dwarf_1ea4145;
    defs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         defs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cVar11 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
             find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                              *)local_470._16_8_,(string_view_type *)sub_keys);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
              ((const_object_range_type *)sub_keys,
               (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)uVar2);
    if ((((undefined1  [16])cVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((sub_keys[0].field_2._M_local_buf[8] & 1) == 0)) {
      if (cVar11.has_value_ != (bool)sub_keys[0].field_2._8_1_) goto LAB_003c22e7;
    }
    else if (cVar11.it_._M_current._M_current !=
             (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)sub_keys[0].field_2._0_8_) {
LAB_003c22e7:
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((const_object_range_type *)&relative,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                 &(cVar11.it_._M_current._M_current)->value_);
      local_450._24_8_ = relative.uri_string_.field_2._M_allocated_capacity;
      local_450[0x10] = (byte)relative.uri_string_._M_string_length;
      _Var7 = relative.uri_string_._M_dataplus;
      while( true ) {
        bVar10 = local_450[0x10] == relative.uri_string_.field_2._M_local_buf[8];
        if (((byte)relative.uri_string_._M_string_length &
             relative.uri_string_.field_2._M_local_buf[8] & 1) != 0) {
          bVar10 = _Var7._M_p == (pointer)local_450._24_8_;
        }
        if (bVar10) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)sub_keys,"definitions",(allocator<char> *)&id);
        std::__cxx11::string::string((string *)(sub_keys + 1),(string *)_Var7._M_p);
        (**(code **)((((uri_wrapper *)local_470._8_8_)->uri_).uri_string_._M_dataplus._M_p + 0x18))
                  (&id,local_470._8_8_,uri,&(((uri_wrapper *)_Var7._M_p)->uri_).scheme_part_,
                   sub_keys,2,in_stack_00000008);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>
        ::
        _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>
                    *)&defs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            _Var7._M_p,
                   (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                    *)&id);
        if (id.uri_string_._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)id.uri_string_._M_dataplus._M_p + 8))();
        }
        lVar9 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&sub_keys[0]._M_dataplus._M_p + lVar9));
          lVar9 = lVar9 + -0x20;
        } while (lVar9 != -0x20);
        _Var7._M_p = (pointer)&(((uri_wrapper *)_Var7._M_p)->uri_).userinfo_part_;
      }
    }
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    basic_json<jsoncons::null_type,void>
              ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
               &default_value,(null_type *)sub_keys);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    as_string<std::allocator<char>>
              (sub_keys,(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                        (local_450._32_8_ + 0x20));
    str._M_str = sub_keys[0]._M_dataplus._M_p;
    str._M_len = sub_keys[0]._M_string_length;
    jsoncons::uri::uri(&relative,str);
    std::__cxx11::string::~string((string *)sub_keys);
    jsoncons::uri::uri((uri *)sub_keys,&uri->uri_);
    jsoncons::uri::resolve(&id,(uri *)sub_keys,&relative);
    std::__cxx11::string::~string((string *)sub_keys);
    uri_wrapper::uri_wrapper((uri_wrapper *)sub_keys,&id);
    schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::get_or_create_reference
              ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_450,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               local_470._8_8_,(uri_wrapper *)local_470._16_8_);
    local_470._0_8_ = local_450._0_8_;
    local_450._0_8_ = (_func_int **)0x0;
    std::
    vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
    ::
    emplace_back<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
              ((vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                *)&validators,
               (unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                *)local_470);
    if ((_Head_base<0UL,_jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
         )local_470._0_8_ !=
        (_Head_base<0UL,_jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
         )0x0) {
      (*(((keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_470._0_8_)->super_validation_message_factory)._vptr_validation_message_factory[1]
      )();
    }
    local_470._0_8_ =
         (keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x0;
    if ((_func_int **)local_450._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_450._0_8_ + 8))();
    }
    local_450._0_8_ =
         (keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x0;
    uri_wrapper::~uri_wrapper((uri_wrapper *)sub_keys);
    jsoncons::uri::uri((uri *)sub_keys,(uri *)&new_context);
    std::
    make_unique<jsoncons::jsonschema::object_schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::uri,std::optional<jsoncons::uri>const&,std::vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>,std::map<std::__cxx11::string,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              ((uri *)local_470,(optional<jsoncons::uri> *)sub_keys,
               (vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
                *)((long)&uri[1].uri_.uri_string_.field_2 + 8),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
                *)&validators,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)&defs);
    local_450._16_8_ = local_470._0_8_;
    local_470._0_8_ =
         (__uniq_ptr_impl<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          )0x0;
    sVar1.
    super_validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ._vptr_validator_base =
         *(validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_450._8_8_;
    *(undefined8 *)local_450._8_8_ = local_450._16_8_;
    if ((sVar1.
         super_validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
         ._vptr_validator_base != (_func_int **)0x0) &&
       ((**(code **)(*(long *)sVar1.
                              super_validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                              ._vptr_validator_base + 8))(),
       (_Head_base<0UL,_jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
        )local_470._0_8_ !=
       (_Head_base<0UL,_jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
        )0x0)) {
      (*(((keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)local_470._0_8_)->super_validation_message_factory)._vptr_validation_message_factory[1]
      )();
    }
    local_470._0_8_ =
         (__uniq_ptr_impl<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          )0x0;
    std::__cxx11::string::~string((string *)sub_keys);
    std::__cxx11::string::~string((string *)&id);
    std::__cxx11::string::~string((string *)&relative);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              (&default_value);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
    ::~_Rb_tree(&defs._M_t);
    std::
    vector<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&validators);
  }
  local_450._24_8_ =
       new_context.uris_.
       super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  while (new_context.uris_.
         super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
         ._M_impl.super__Vector_impl_data._M_start != (pointer)local_450._24_8_) {
    uri = new_context.uris_.
          super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
          ._M_impl.super__Vector_impl_data._M_start;
    schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::insert_schema((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)local_470._8_8_,
                    new_context.uris_.
                    super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)local_450._16_8_);
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_range_abi_cxx11_
              ((const_object_range_type *)sub_keys,
               (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
               local_470._16_8_);
    uVar4 = sub_keys[0].field_2._M_local_buf[8];
    uVar2 = sub_keys[0].field_2._M_allocated_capacity;
    bVar3 = (byte)sub_keys[0]._M_string_length;
    bVar8 = (byte)sub_keys[0]._M_string_length & sub_keys[0].field_2._M_local_buf[8];
    _Var7 = sub_keys[0]._M_dataplus;
    while( true ) {
      bVar10 = bVar3 == uVar4;
      if ((bVar8 & 1) != 0) {
        bVar10 = _Var7._M_p == (pointer)uVar2;
      }
      if (bVar10) break;
      this_00 = &schema_validator_factory_4<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                 ::known_keywords_abi_cxx11_()->_M_h;
      cVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(this_00,(key_type *)_Var7._M_p);
      schema_validator_factory_4<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::known_keywords_abi_cxx11_();
      if (cVar6.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ::insert_unknown_keyword
                  ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)local_470._8_8_,uri,(string *)_Var7._M_p,
                   (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   ((long)_Var7._M_p + 0x20));
      }
      _Var7._M_p = (pointer)&((key_type *)((long)_Var7._M_p + 0x20))->field_2;
    }
    new_context.uris_.
    super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
    ._M_impl.super__Vector_impl_data._M_start = uri + 1;
  }
LAB_003c22c3:
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~compilation_context(&new_context);
  return (__uniq_ptr_data<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(tuple<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )local_450._8_8_;
}

Assistant:

schema_validator_ptr_type make_schema_validator( 
            const compilation_context<Json>& context, const Json& sch, jsoncons::span<const std::string> keys, 
            anchor_uri_map_type& anchor_dict) override
        {
            auto new_context = make_compilation_context(context, sch, keys);
            //std::cout << "make_schema_validator " << context.get_base_uri().string() << ", " << new_context.get_base_uri().string() << "\n\n";

            schema_validator_ptr_type schema_validator_ptr;

            switch (sch.type())
            {
                case json_type::bool_value:
                {
                    schema_validator_ptr = this->make_boolean_schema(new_context, sch);
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                    }          
                    break;
                }
                case json_type::object_value:
                {
                    auto it = sch.find("$ref");
                    if (it != sch.object_range().end()) // this schema is a reference
                    {
                        std::vector<keyword_validator_ptr_type> validators;
                        std::map<std::string,schema_validator_ptr_type> defs;

                        auto it2 = sch.find("definitions");
                        if (it2 != sch.object_range().end()) 
                        {
                            for (const auto& def : it2->value().object_range())
                            {
                                std::string sub_keys[] = { "definitions", def.key() };
                                defs.emplace(def.key(), make_schema_validator(context, def.value(), sub_keys, anchor_dict));
                            }
                        }

                        Json default_value{ jsoncons::null_type() };
                        uri relative((*it).value().template as<std::string>()); 
                        auto id = context.get_base_uri().resolve(relative);
                        validators.push_back(this->get_or_create_reference(sch, uri_wrapper{id}));
                        schema_validator_ptr = jsoncons::make_unique<object_schema_validator<Json>>(
                            new_context.get_base_uri(), context.id(),
                            std::move(validators), std::move(defs), std::move(default_value));
                    }
                    else
                    {
                        schema_validator_ptr = make_object_schema_validator(new_context, sch, anchor_dict);
                    }
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                        for (const auto& item : sch.object_range())
                        {
                            if (known_keywords().find(item.key()) == known_keywords().end())
                            {
                                this->insert_unknown_keyword(uri, item.key(), item.value()); // save unknown keywords for later reference
                            }
                        }
                    }          
                    break;
                }
                default:
                    JSONCONS_THROW(schema_error("invalid JSON-type for a schema for " + new_context.get_base_uri().string() + ", expected: boolean or object"));
                    break;
            }
            
            return schema_validator_ptr;
        }